

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

bool __thiscall QMenu::isEmpty(QMenu *this)

{
  bool bVar1;
  qsizetype qVar2;
  const_reference ppQVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QAction *action;
  int i;
  bool ret;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  QAction *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  byte in_stack_ffffffffffffff8f;
  byte bVar5;
  byte local_61;
  int local_48;
  QList<QAction_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = true;
  local_48 = 0;
  while( true ) {
    local_61 = 0;
    bVar5 = local_61;
    if (bVar1 != false) {
      QWidget::actions((QWidget *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      qVar2 = QList<QAction_*>::size(&local_20);
      bVar5 = local_48 < qVar2;
      QList<QAction_*>::~QList((QList<QAction_*> *)0x647041);
    }
    in_stack_ffffffffffffff8f = bVar5;
    if ((in_stack_ffffffffffffff8f & 1) == 0) break;
    QWidget::actions((QWidget *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    ppQVar3 = QList<QAction_*>::at
                        ((QList<QAction_*> *)in_stack_ffffffffffffff80,
                         CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff80 = *ppQVar3;
    QList<QAction_*>::~QList((QList<QAction_*> *)0x64707b);
    uVar4 = QAction::isSeparator();
    if (((uVar4 & 1) == 0) && (uVar4 = QAction::isVisible(), (uVar4 & 1) != 0)) {
      bVar1 = false;
    }
    local_48 = local_48 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QMenu::isEmpty() const
{
    bool ret = true;
    for(int i = 0; ret && i < actions().size(); ++i) {
        const QAction *action = actions().at(i);
        if (!action->isSeparator() && action->isVisible()) {
            ret = false;
        }
    }
    return ret;
}